

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KaxBlock.cpp
# Opt level: O3

KaxInternalBlock * __thiscall
libmatroska::KaxBlockBlob::operator_cast_to_KaxInternalBlock_(KaxBlockBlob *this)

{
  KaxBlockGroup *this_00;
  KaxInternalBlock *pKVar1;
  
  this_00 = (this->Block).group;
  if (this_00 == (KaxBlockGroup *)0x0) {
    __assert_fail("Block.group",
                  "/workspace/llm4binary/github/license_c_cmakelists/gabrieleilertsen[P]lumahdrv/lib/matroska/src/KaxBlock.cpp"
                  ,0x3ba,
                  "KaxInternalBlock &libmatroska::KaxBlockBlob::operator libmatroska::KaxInternalBlock &()"
                 );
  }
  if (this->bUseSimpleBlock != false) {
    return (KaxInternalBlock *)this_00;
  }
  pKVar1 = (KaxInternalBlock *)
           libebml::EbmlMaster::FindFirstElt
                     (&this_00->super_EbmlMaster,(EbmlCallbacks *)KaxBlock::ClassInfos,true);
  return pKVar1;
}

Assistant:

KaxBlockBlob::operator KaxInternalBlock &()
{
  assert(Block.group);
#if MATROSKA_VERSION >= 2
  if (bUseSimpleBlock)
    return *Block.simpleblock;
  else
#endif
    return *Block.group;
}